

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Local * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Local>(Allocator *this,Local *ast)

{
  Local *this_00;
  Local *r;
  Local *in_stack_ffffffffffffffd0;
  
  this_00 = (Local *)operator_new(0xa0);
  Local::Local(in_stack_ffffffffffffffd0,this_00);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }